

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LoopPeeling::FixExitCondition
          (LoopPeeling *this,
          function<unsigned_int_(spvtools::opt::Instruction_*)> *condition_builder)

{
  uint *puVar1;
  IRContext *pIVar2;
  CFG *this_00;
  Instruction *pIVar3;
  pointer puVar4;
  pointer puVar5;
  BasicBlock *this_01;
  pointer pOVar6;
  Loop *pLVar7;
  uint32_t uVar8;
  array<signed_char,_4UL> aVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  size_type sVar11;
  mapped_type *ppBVar12;
  Instruction *pIVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  pointer puVar17;
  undefined1 local_68 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_48;
  _Any_data *local_40;
  CFG *local_38;
  
  pIVar2 = this->context_;
  local_40 = (_Any_data *)condition_builder;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar3 = (this->cloned_loop_->loop_merge_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar3->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  local_38 = this_00;
  pvVar10 = CFG::preds(this_00,uVar8);
  puVar4 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar16 = 0;
  if (puVar4 != puVar5) {
    do {
      puVar17 = puVar4 + 1;
      uVar16 = *puVar4;
      local_68._0_4_ = uVar16;
      sVar11 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(this->cloned_loop_->loop_basic_blocks_)._M_h,(key_type_conflict *)local_68)
      ;
      if (sVar11 != 0) break;
      uVar16 = 0;
      puVar4 = puVar17;
    } while (puVar17 != puVar5);
  }
  if (uVar16 == 0) {
    __assert_fail("condition_block_id != 0 && \"2nd loop in improperly connected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x142,
                  "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
                 );
  }
  local_68._0_4_ = uVar16;
  ppBVar12 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&local_38->id2block_,(key_type *)local_68);
  this_01 = *ppBVar12;
  pIVar3 = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 == (Instruction *)0x0) ||
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  pIVar3 = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if (pIVar3->opcode_ != OpBranchConditional) {
    __assert_fail("exit_condition->opcode() == spv::Op::OpBranchConditional",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x146,
                  "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
                 );
  }
  pIVar13 = BasicBlock::GetMergeInst(this_01);
  local_68._0_8_ = pIVar3;
  if (pIVar13 != (Instruction *)0x0) {
    local_68._0_8_ = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
  }
  if (*(long *)(local_40 + 1) != 0) {
    local_68._16_4_ = (**(code **)(local_40->_M_pod_data + 0x18))(local_40,(Instruction **)local_68)
    ;
    local_68._0_8_ = &PTR__SmallVector_003e9b28;
    puVar1 = (uint *)(local_68 + 0x10);
    local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_68._8_8_ = 1;
    uVar14 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar14 = (ulong)pIVar3->has_result_id_;
    }
    pOVar6 = (pIVar3->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar15 = ((long)(pIVar3->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 4) *
             -0x5555555555555555;
    if (uVar14 <= uVar15 && uVar15 - uVar14 != 0) {
      local_68._24_8_ = puVar1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar6->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar14 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_68);
      local_68._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_48,local_48._M_head_impl);
      }
      pLVar7 = this->cloned_loop_;
      uVar16 = (pIVar3->has_result_id_ & 1) + 1;
      if (pIVar3->has_type_id_ == false) {
        uVar16 = (uint)pIVar3->has_result_id_;
      }
      uVar8 = Instruction::GetSingleWordOperand(pIVar3,uVar16 + 1);
      local_68._0_4_ = uVar8;
      sVar11 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(pLVar7->loop_basic_blocks_)._M_h,(key_type_conflict *)local_68);
      uVar16 = (pIVar3->has_result_id_ & 1) + 1;
      if (pIVar3->has_type_id_ == false) {
        uVar16 = (uint)pIVar3->has_result_id_;
      }
      local_68._16_4_ = Instruction::GetSingleWordOperand(pIVar3,uVar16 + 1 + (uint)(sVar11 == 0));
      local_68._0_8_ = &PTR__SmallVector_003e9b28;
      local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_68._8_8_ = 1;
      uVar14 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
      if (pIVar3->has_type_id_ == false) {
        uVar14 = (ulong)pIVar3->has_result_id_;
      }
      uVar14 = uVar14 + 1;
      pOVar6 = (pIVar3->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar15 = ((long)(pIVar3->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 4) *
               -0x5555555555555555;
      if (uVar14 <= uVar15 && uVar15 - uVar14 != 0) {
        local_68._24_8_ = puVar1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar6->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar14 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_68);
        local_68._0_8_ = &PTR__SmallVector_003e9b28;
        if (local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_48,local_48._M_head_impl);
        }
        pIVar13 = (this->cloned_loop_->loop_merge_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        aVar9._M_elems[0] = '\0';
        aVar9._M_elems[1] = '\0';
        aVar9._M_elems[2] = '\0';
        aVar9._M_elems[3] = '\0';
        if (pIVar13->has_result_id_ == true) {
          aVar9._M_elems =
               (_Type)Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
        }
        local_68._0_8_ = &PTR__SmallVector_003e9b28;
        local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_68._8_8_ = 1;
        uVar14 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar14 = (ulong)pIVar3->has_result_id_;
        }
        uVar14 = uVar14 + 2;
        pOVar6 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(pIVar3->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 4) *
                 -0x5555555555555555;
        local_68._16_4_ = aVar9._M_elems;
        if (uVar14 <= uVar15 && uVar15 - uVar14 != 0) {
          local_68._24_8_ = puVar1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)((pOVar6->words).buffer + 0xfffffffffffffffc) +
                     (ulong)(uint)((int)uVar14 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_68);
          local_68._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_48,local_48._M_head_impl);
          }
          pIVar2 = this->context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          analysis::DefUseManager::AnalyzeInstUse
                    ((pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,pIVar3);
          return;
        }
      }
    }
    local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_68._8_8_ = 1;
    local_68._0_8_ = &PTR__SmallVector_003e9b28;
    local_68._24_8_ = puVar1;
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b8,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  std::__throw_bad_function_call();
}

Assistant:

void LoopPeeling::FixExitCondition(
    const std::function<uint32_t(Instruction*)>& condition_builder) {
  CFG& cfg = *context_->cfg();

  uint32_t condition_block_id = 0;
  for (uint32_t id : cfg.preds(GetClonedLoop()->GetMergeBlock()->id())) {
    if (GetClonedLoop()->IsInsideLoop(id)) {
      condition_block_id = id;
      break;
    }
  }
  assert(condition_block_id != 0 && "2nd loop in improperly connected");

  BasicBlock* condition_block = cfg.block(condition_block_id);
  Instruction* exit_condition = condition_block->terminator();
  assert(exit_condition->opcode() == spv::Op::OpBranchConditional);
  BasicBlock::iterator insert_point = condition_block->tail();
  if (condition_block->GetMergeInst()) {
    --insert_point;
  }

  exit_condition->SetInOperand(0, {condition_builder(&*insert_point)});

  uint32_t to_continue_block_idx =
      GetClonedLoop()->IsInsideLoop(exit_condition->GetSingleWordInOperand(1))
          ? 1
          : 2;
  exit_condition->SetInOperand(
      1, {exit_condition->GetSingleWordInOperand(to_continue_block_idx)});
  exit_condition->SetInOperand(2, {GetClonedLoop()->GetMergeBlock()->id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(exit_condition);
}